

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O3

void Bbl_ManTest(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Bbl_Man_t *p;
  Bbl_Man_t *p_00;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  timespec ts;
  timespec local_68;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  Abc_Ntk_t *local_38;
  
  iVar1 = clock_gettime(3,&local_68);
  if (iVar1 < 0) {
    local_40 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    local_40 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  p = Bbl_ManFromAbc(pNtk);
  Bbl_ManPrintStats(p);
  iVar1 = clock_gettime(3,&local_68);
  if (iVar1 < 0) {
    local_48 = -1;
  }
  else {
    local_48 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  iVar1 = clock_gettime(3,&local_68);
  if (iVar1 < 0) {
    local_50 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    local_50 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  Bbl_ManDumpBinaryBlif(p,"test.bblif");
  iVar1 = clock_gettime(3,&local_68);
  if (iVar1 < 0) {
    lVar2 = -1;
  }
  else {
    lVar2 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  iVar1 = clock_gettime(3,&local_68);
  if (iVar1 < 0) {
    local_58 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    local_58 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  p_00 = Bbl_ManReadBinaryBlif("test.bblif");
  Bbl_ManStop(p);
  iVar1 = clock_gettime(3,&local_68);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  iVar1 = clock_gettime(3,&local_68);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  local_38 = Bbl_ManToAig(p_00);
  Bbl_ManStop(p_00);
  iVar1 = clock_gettime(3,&local_68);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  iVar1 = clock_gettime(3,&local_68);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  Abc_NtkDelete(local_38);
  iVar1 = clock_gettime(3,&local_68);
  if (iVar1 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  lVar3 = lVar3 + local_58;
  lVar2 = lVar2 + local_50;
  lVar7 = local_48 + local_40;
  iVar1 = 0xa29830;
  puts("Runtime stats:");
  Abc_Print(iVar1,"%s =","ABC to Man");
  Abc_Print(iVar1,"%9.2f sec\n",(double)lVar7 / 1000000.0);
  Abc_Print(iVar1,"%s =","Writing   ");
  Abc_Print(iVar1,"%9.2f sec\n",(double)lVar2 / 1000000.0);
  Abc_Print(iVar1,"%s =","Reading   ");
  Abc_Print(iVar1,"%9.2f sec\n",(double)lVar3 / 1000000.0);
  Abc_Print(iVar1,"%s =","Man to ABC");
  Abc_Print(iVar1,"%9.2f sec\n",(double)(lVar6 + lVar4) / 1000000.0);
  Abc_Print(iVar1,"%s =","Verify    ");
  Abc_Print(iVar1,"%9.2f sec\n",(double)(lVar8 + lVar5) / 1000000.0);
  return;
}

Assistant:

void Bbl_ManTest( Abc_Ntk_t * pNtk )
{
    extern Bbl_Man_t * Bbl_ManFromAbc( Abc_Ntk_t * pNtk );

    Abc_Ntk_t * pNtkNew;
    Bbl_Man_t * p, * pNew;
    char * pFileName = "test.bblif";
    abctime clk, clk1, clk2, clk3, clk4, clk5;
clk = Abc_Clock();
    p = Bbl_ManFromAbc( pNtk );
    Bbl_ManPrintStats( p );
clk1 = Abc_Clock() - clk;
//Bbl_ManDumpBlif( p, "test_bbl.blif" );

    // write into file and back
clk = Abc_Clock();
    Bbl_ManDumpBinaryBlif( p, pFileName );
clk2 = Abc_Clock() - clk;

    // read from file
clk = Abc_Clock();
    pNew = Bbl_ManReadBinaryBlif( pFileName );
    Bbl_ManStop( p ); p = pNew;
clk3 = Abc_Clock() - clk;

    // generate ABC network
clk = Abc_Clock();
    pNtkNew = Bbl_ManToAig( p );
//    pNtkNew = Bbl_ManToAbc( p );
    Bbl_ManStop( p );
clk4 = Abc_Clock() - clk;

    // equivalence check
clk = Abc_Clock();
//    Bbl_ManVerify( pNtk, pNtkNew );
    Abc_NtkDelete( pNtkNew );
clk5 = Abc_Clock() - clk;

printf( "Runtime stats:\n" );
ABC_PRT( "ABC to Man", clk1 );
ABC_PRT( "Writing   ", clk2 );
ABC_PRT( "Reading   ", clk3 );
ABC_PRT( "Man to ABC", clk4 );
ABC_PRT( "Verify    ", clk5 );
}